

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_parse_info.cpp
# Opt level: O1

unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>,_true> __thiscall
duckdb::SetColumnCommentInfo::Deserialize(SetColumnCommentInfo *this,Deserializer *deserializer)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> **pp_Var1;
  CatalogType CVar2;
  int iVar3;
  uint uVar4;
  SetColumnCommentInfo *this_00;
  pointer pSVar5;
  pointer *__ptr;
  unique_ptr<duckdb::SetColumnCommentInfo,_std::default_delete<duckdb::SetColumnCommentInfo>,_true>
  result;
  string str;
  _Head_base<0UL,_duckdb::SetColumnCommentInfo_*,_false> local_78;
  Value local_70;
  
  this_00 = (SetColumnCommentInfo *)operator_new(0xd8);
  SetColumnCommentInfo(this_00);
  local_78._M_head_impl = this_00;
  pSVar5 = unique_ptr<duckdb::SetColumnCommentInfo,_std::default_delete<duckdb::SetColumnCommentInfo>,_true>
           ::operator->((unique_ptr<duckdb::SetColumnCommentInfo,_std::default_delete<duckdb::SetColumnCommentInfo>,_true>
                         *)&local_78);
  (*deserializer->_vptr_Deserializer[2])(deserializer,300,"catalog_entry_type");
  if (deserializer->deserialize_enum_from_string == true) {
    (*deserializer->_vptr_Deserializer[0x1a])(&local_70,deserializer);
    CVar2 = EnumUtil::FromString<duckdb::CatalogType>((char *)local_70.type_._0_8_);
    if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_70.type_._0_8_ !=
        &local_70.type_.type_info_.internal.
         super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount) {
      operator_delete((void *)local_70.type_._0_8_);
    }
  }
  else {
    iVar3 = (*deserializer->_vptr_Deserializer[0xf])(deserializer);
    CVar2 = (CatalogType)iVar3;
  }
  (pSVar5->super_AlterInfo).field_0x71 = CVar2;
  (*deserializer->_vptr_Deserializer[3])(deserializer);
  pSVar5 = unique_ptr<duckdb::SetColumnCommentInfo,_std::default_delete<duckdb::SetColumnCommentInfo>,_true>
           ::operator->((unique_ptr<duckdb::SetColumnCommentInfo,_std::default_delete<duckdb::SetColumnCommentInfo>,_true>
                         *)&local_78);
  (*deserializer->_vptr_Deserializer[2])(deserializer,0x12d,"comment_value");
  (*deserializer->_vptr_Deserializer[6])(deserializer);
  Value::Deserialize(&local_70,deserializer);
  (*deserializer->_vptr_Deserializer[7])(deserializer);
  Value::operator=(&pSVar5->comment_value,&local_70);
  Value::~Value(&local_70);
  (*deserializer->_vptr_Deserializer[3])(deserializer);
  pSVar5 = unique_ptr<duckdb::SetColumnCommentInfo,_std::default_delete<duckdb::SetColumnCommentInfo>,_true>
           ::operator->((unique_ptr<duckdb::SetColumnCommentInfo,_std::default_delete<duckdb::SetColumnCommentInfo>,_true>
                         *)&local_78);
  uVar4 = (*deserializer->_vptr_Deserializer[4])(deserializer,0x12e,"column_name");
  if ((char)uVar4 == '\0') {
    pp_Var1 = (__shared_count<(__gnu_cxx::_Lock_policy)2> **)
              &local_70.type_.type_info_.internal.
               super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    local_70.type_.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_70.type_.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_1_ =
         0;
    local_70.type_._0_8_ = pp_Var1;
    ::std::__cxx11::string::operator=((string *)&pSVar5->column_name,(string *)&local_70);
    if ((__shared_count<(__gnu_cxx::_Lock_policy)2> **)local_70.type_._0_8_ == pp_Var1)
    goto LAB_005d2429;
  }
  else {
    (*deserializer->_vptr_Deserializer[0x1a])(&local_70,deserializer);
    ::std::__cxx11::string::operator=((string *)&pSVar5->column_name,(string *)&local_70);
    if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_70.type_._0_8_ ==
        &local_70.type_.type_info_.internal.
         super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
    goto LAB_005d2429;
  }
  operator_delete((void *)local_70.type_._0_8_);
LAB_005d2429:
  (*deserializer->_vptr_Deserializer[5])(deserializer,(ulong)(uVar4 & 0xff));
  (this->super_AlterInfo).super_ParseInfo._vptr_ParseInfo = (_func_int **)local_78._M_head_impl;
  return (unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>_>)
         (unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>_>)this;
}

Assistant:

unique_ptr<AlterInfo> SetColumnCommentInfo::Deserialize(Deserializer &deserializer) {
	auto result = duckdb::unique_ptr<SetColumnCommentInfo>(new SetColumnCommentInfo());
	deserializer.ReadProperty<CatalogType>(300, "catalog_entry_type", result->catalog_entry_type);
	deserializer.ReadProperty<Value>(301, "comment_value", result->comment_value);
	deserializer.ReadPropertyWithDefault<string>(302, "column_name", result->column_name);
	return std::move(result);
}